

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O2

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  int iVar1;
  int i;
  long lVar2;
  Name nam;
  char *local_30;
  
  for (lVar2 = 0; lVar2 < (this->set).thenum; lVar2 = lVar2 + 1) {
    if (*(int *)(__filename + lVar2 * 4) < 0) {
      local_30 = this->mem + (this->set).theitem[(this->set).thekey[lVar2].idx].data;
      DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::remove
                (&this->hashtab,(char *)&local_30);
    }
  }
  iVar1 = DataSet<int>::remove(&this->set,__filename);
  return iVar1;
}

Assistant:

void NameSet::remove(int dstat[])
{
   for(int i = 0; i < set.num(); i++)
   {
      if(dstat[i] < 0)
      {
         const Name nam = &mem[set[i]];
         hashtab.remove(nam);
      }
   }

   set.remove(dstat);

   assert(isConsistent());
}